

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRaycastVehicle.cpp
# Opt level: O0

void __thiscall
btRaycastVehicle::updateWheelTransform
          (btRaycastVehicle *this,int wheelIndex,bool interpolatedTransform)

{
  btVector3 *pbVar1;
  btMatrix3x3 *this_00;
  btScalar *pbVar2;
  btScalar *pbVar3;
  btScalar *pbVar4;
  byte in_DL;
  int in_ESI;
  btQuaternion *in_RDI;
  btVector3 bVar5;
  btMatrix3x3 basis2;
  btMatrix3x3 rotatingMat;
  btQuaternion rotatingOrn;
  btMatrix3x3 steeringMat;
  btQuaternion steeringOrn;
  btScalar steering;
  btVector3 fwd;
  btVector3 *right;
  btVector3 up;
  btWheelInfo *wheel;
  btMatrix3x3 *basis;
  btVector3 *in_stack_fffffffffffffdc0;
  btTransform *pbVar6;
  btVector3 *in_stack_fffffffffffffdc8;
  btVector3 *in_stack_fffffffffffffdd0;
  btVector3 *v;
  btMatrix3x3 *pbVar7;
  btVector3 *this_01;
  btVector3 *this_02;
  undefined8 in_stack_fffffffffffffe30;
  undefined1 interpolatedTransform_00;
  btWheelInfo *in_stack_fffffffffffffe38;
  btRaycastVehicle *in_stack_fffffffffffffe40;
  btScalar *zy;
  btScalar *zz;
  btTransform *m1;
  btVector3 local_170 [7];
  btMatrix3x3 local_100;
  btScalar local_d0 [12];
  btScalar local_a0;
  btScalar local_8c [12];
  undefined1 local_5c [44];
  btVector3 local_30;
  btWheelInfo *local_20;
  byte local_15;
  
  interpolatedTransform_00 = (undefined1)((ulong)in_stack_fffffffffffffe30 >> 0x38);
  local_15 = in_DL & 1;
  local_20 = btAlignedObjectArray<btWheelInfo>::operator[]
                       ((btAlignedObjectArray<btWheelInfo> *)(in_RDI + 0xc),in_ESI);
  updateWheelTransformsWS
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(bool)interpolatedTransform_00);
  bVar5 = operator-(in_stack_fffffffffffffdc0);
  local_30.m_floats._0_8_ = bVar5.m_floats._0_8_;
  local_30.m_floats._8_8_ = bVar5.m_floats._8_8_;
  local_5c._36_8_ = &(local_20->m_raycastInfo).m_wheelAxleWS;
  this_02 = &local_30;
  bVar5 = btVector3::cross(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  local_5c._20_8_ = bVar5.m_floats._0_8_;
  local_5c._28_8_ = bVar5.m_floats._8_8_;
  this_01 = (btVector3 *)(local_5c + 0x14);
  pbVar1 = btVector3::normalize(in_stack_fffffffffffffdc0);
  local_5c._20_8_ = *(undefined8 *)pbVar1->m_floats;
  local_5c._28_8_ = *(undefined8 *)(pbVar1->m_floats + 2);
  local_5c._16_4_ = local_20->m_steering;
  pbVar7 = (btMatrix3x3 *)local_5c;
  btQuaternion::btQuaternion
            ((btQuaternion *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc0->m_floats);
  zy = local_8c;
  btMatrix3x3::btMatrix3x3(pbVar7,in_RDI);
  local_a0 = -local_20->m_rotation;
  btQuaternion::btQuaternion
            ((btQuaternion *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc0->m_floats);
  zz = local_d0;
  btMatrix3x3::btMatrix3x3(pbVar7,in_RDI);
  this_00 = (btMatrix3x3 *)btVector3::operator_cast_to_float_((btVector3 *)local_5c._36_8_);
  btVector3::operator_cast_to_float_(this_01);
  btVector3::operator_cast_to_float_(this_02);
  pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)local_5c._36_8_);
  pbVar2 = pbVar2 + 1;
  pbVar3 = btVector3::operator_cast_to_float_(this_01);
  pbVar3 = pbVar3 + 1;
  pbVar4 = btVector3::operator_cast_to_float_(this_02);
  basis = (btMatrix3x3 *)(pbVar4 + 1);
  pbVar4 = btVector3::operator_cast_to_float_((btVector3 *)local_5c._36_8_);
  pbVar6 = (btTransform *)(pbVar4 + 2);
  pbVar4 = btVector3::operator_cast_to_float_(this_01);
  pbVar1 = (btVector3 *)(pbVar4 + 2);
  pbVar4 = btVector3::operator_cast_to_float_(this_02);
  v = (btVector3 *)(pbVar4 + 2);
  pbVar7 = &local_100;
  btMatrix3x3::btMatrix3x3
            (this_00,(btScalar *)basis,(btScalar *)pbVar6,pbVar1->m_floats,this_02->m_floats,
             this_01->m_floats,pbVar2,pbVar3,zy,zz);
  m1 = &local_20->m_worldTransform;
  ::operator*(&m1->m_basis,pbVar7);
  ::operator*(&m1->m_basis,pbVar7);
  btTransform::setBasis(pbVar6,basis);
  pbVar6 = &local_20->m_worldTransform;
  ::operator*(v,pbVar1->m_floats);
  bVar5 = operator+(v,pbVar1);
  local_170[0].m_floats._0_8_ = bVar5.m_floats._0_8_;
  local_170[0].m_floats._8_8_ = bVar5.m_floats._8_8_;
  btTransform::setOrigin(pbVar6,local_170);
  return;
}

Assistant:

void	btRaycastVehicle::updateWheelTransform( int wheelIndex , bool interpolatedTransform)
{
	
	btWheelInfo& wheel = m_wheelInfo[ wheelIndex ];
	updateWheelTransformsWS(wheel,interpolatedTransform);
	btVector3 up = -wheel.m_raycastInfo.m_wheelDirectionWS;
	const btVector3& right = wheel.m_raycastInfo.m_wheelAxleWS;
	btVector3 fwd = up.cross(right);
	fwd = fwd.normalize();
//	up = right.cross(fwd);
//	up.normalize();

	//rotate around steering over de wheelAxleWS
	btScalar steering = wheel.m_steering;
	
	btQuaternion steeringOrn(up,steering);//wheel.m_steering);
	btMatrix3x3 steeringMat(steeringOrn);

	btQuaternion rotatingOrn(right,-wheel.m_rotation);
	btMatrix3x3 rotatingMat(rotatingOrn);

	btMatrix3x3 basis2(
		right[0],fwd[0],up[0],
		right[1],fwd[1],up[1],
		right[2],fwd[2],up[2]
	);
	
	wheel.m_worldTransform.setBasis(steeringMat * rotatingMat * basis2);
	wheel.m_worldTransform.setOrigin(
		wheel.m_raycastInfo.m_hardPointWS + wheel.m_raycastInfo.m_wheelDirectionWS * wheel.m_raycastInfo.m_suspensionLength
	);
}